

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
google::protobuf::UninterpretedOption_NamePart::InternalSwap
          (UninterpretedOption_NamePart *this,UninterpretedOption_NamePart *other)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  long __tmp;
  
  uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar6 = uVar3;
  if ((uVar3 & 1) != 0) {
    uVar6 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
  }
  uVar4 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar7 = uVar4;
  if ((uVar4 & 1) != 0) {
    uVar7 = *(ulong *)(uVar4 & 0xfffffffffffffffe);
  }
  if (uVar6 == uVar7) {
    (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar4;
    (other->super_Message).super_MessageLite._internal_metadata_.ptr_ = uVar3;
    uVar2 = (this->field_0)._impl_._has_bits_.has_bits_[0];
    (this->field_0)._impl_._has_bits_.has_bits_[0] = (other->field_0)._impl_._has_bits_.has_bits_[0]
    ;
    (other->field_0)._impl_._has_bits_.has_bits_[0] = uVar2;
    pvVar5 = (other->field_0)._impl_.name_part_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.name_part_.tagged_ptr_.ptr_ =
         (this->field_0)._impl_.name_part_.tagged_ptr_.ptr_;
    (this->field_0)._impl_.name_part_.tagged_ptr_.ptr_ = pvVar5;
    bVar1 = (this->field_0)._impl_.is_extension_;
    (this->field_0)._impl_.is_extension_ = (other->field_0)._impl_.is_extension_;
    (other->field_0)._impl_.is_extension_ = bVar1;
    return;
  }
  InternalSwap();
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }